

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsJacobianWRTControlSparsity
          (OptimalControlProblem *this,SparsityStructure *controlSparsity)

{
  OptimalControlProblemPimpl *pOVar1;
  SparsityStructure *pSVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  _Rb_tree_node_base *p_Var7;
  ostream *poVar8;
  size_t newCol;
  NonZero NVar9;
  ostringstream errorMsg;
  bool local_1f1;
  string local_1f0;
  long local_1d0;
  SparsityStructure *local_1c8;
  _Rb_tree_node_base *local_1c0;
  _Rb_tree_node_base *local_1b8;
  long local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = controlSparsity;
  SparsityStructure::clear(&this->m_pimpl->controlJacobianSparsity);
  p_Var7 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1c0 = &(this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1f1 = p_Var7 == local_1c0;
  if (!local_1f1) {
    local_1d0 = 0;
    do {
      bVar3 = ConstraintsGroup::constraintJacobianWRTControlSparsity
                        ((ConstraintsGroup *)**(undefined8 **)(p_Var7 + 2),
                         (SparsityStructure *)(*(undefined8 **)(p_Var7 + 2) + 0x30));
      *(bool *)(*(long *)(p_Var7 + 2) + 0x1e9) = bVar3;
      if (bVar3) {
        sVar4 = SparsityStructure::size((SparsityStructure *)(*(long *)(p_Var7 + 2) + 0x180));
        if (sVar4 != 0) {
          sVar4 = 0;
          do {
            pOVar1 = this->m_pimpl;
            NVar9 = SparsityStructure::operator[]
                              ((SparsityStructure *)(*(long *)(p_Var7 + 2) + 0x180),sVar4);
            sVar5 = NVar9.row + local_1d0;
            NVar9 = SparsityStructure::operator[]
                              ((SparsityStructure *)(*(long *)(p_Var7 + 2) + 0x180),sVar4);
            SparsityStructure::add(&pOVar1->controlJacobianSparsity,sVar5,NVar9.col);
            sVar4 = sVar4 + 1;
            sVar5 = SparsityStructure::size((SparsityStructure *)(*(long *)(p_Var7 + 2) + 0x180));
          } while (sVar4 < sVar5);
        }
LAB_00149354:
        lVar6 = iDynTree::MatrixDynSize::rows();
        local_1d0 = local_1d0 + lVar6;
        bVar3 = true;
      }
      else {
        if ((this->m_pimpl->dynamicalSystem).
            super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0) {
          lVar6 = iDynTree::MatrixDynSize::rows();
          sVar4 = iDynTree::MatrixDynSize::cols();
          local_1b0 = lVar6;
          if (lVar6 != 0) {
            lVar6 = 0;
            local_1b8 = p_Var7;
            do {
              if (sVar4 != 0) {
                sVar5 = local_1d0 + lVar6;
                newCol = 0;
                do {
                  SparsityStructure::add(&this->m_pimpl->controlJacobianSparsity,sVar5,newCol);
                  newCol = newCol + 1;
                } while (sVar4 != newCol);
              }
              lVar6 = lVar6 + 1;
              p_Var7 = local_1b8;
            } while (lVar6 != local_1b0);
          }
          goto LAB_00149354;
        }
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The group ",10);
        ConstraintsGroup::name_abi_cxx11_
                  (&local_1f0,(ConstraintsGroup *)**(undefined8 **)(p_Var7 + 2));
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,
                            local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   " has dense control jacobian and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown."
                   ,0x90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","constraintJacobianWRTControlSparsity",
                   local_1f0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar3 = false;
      }
      if (!bVar3) {
        return local_1f1;
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      local_1f1 = p_Var7 == local_1c0;
    } while (!local_1f1);
  }
  pSVar2 = local_1c8;
  pOVar1 = this->m_pimpl;
  if (&pOVar1->controlJacobianSparsity != local_1c8) {
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_1c8,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&pOVar1->controlJacobianSparsity);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&pSVar2->m_nonZeroElementRows,&(pOVar1->controlJacobianSparsity).m_nonZeroElementRows);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&pSVar2->m_nonZeroElementColumns,
             &(pOVar1->controlJacobianSparsity).m_nonZeroElementColumns);
  return local_1f1;
}

Assistant:

bool OptimalControlProblem::constraintsJacobianWRTControlSparsity(SparsityStructure &controlSparsity)
        {
            size_t offset = 0;
            m_pimpl->controlJacobianSparsity.clear();
            for (auto& group : m_pimpl->constraintsGroups){

                group.second->hasControlJacobianSparsity = group.second->group_ptr->constraintJacobianWRTControlSparsity(group.second->controlJacobianSparsity);

                if (group.second->hasControlJacobianSparsity) {

                    for (size_t i = 0; i < group.second->controlJacobianSparsity.size(); ++i) {
                        m_pimpl->controlJacobianSparsity.add(group.second->controlJacobianSparsity[i].row + offset,
                                                             group.second->controlJacobianSparsity[i].col);
                    }

                } else {

                    if (m_pimpl->dynamicalSystem) {

                        size_t rows = group.second->controlJacobianBuffer.rows();
                        size_t cols = group.second->controlJacobianBuffer.cols();

                        for (size_t i = 0; i < rows; ++i) {
                            for (size_t j = 0; j < cols; ++j) {
                                m_pimpl->controlJacobianSparsity.add(i + offset, j);
                            }
                        }
                    } else {
                        std::ostringstream errorMsg;
                        errorMsg << "The group " << group.second->group_ptr->name() <<" has dense control jacobian and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown.";
                        reportError("OptimalControlProblem", "constraintJacobianWRTControlSparsity", errorMsg.str().c_str());
                        return false;
                    }
                }

                offset += group.second->controlJacobianBuffer.rows();
            }

            controlSparsity = m_pimpl->controlJacobianSparsity;

            return true;
        }